

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O2

fec_t * fec_new(uint k,uint n)

{
  ulong uVar1;
  uint __line;
  gf *pgVar2;
  ulong uVar3;
  int iVar4;
  gf *pgVar5;
  gf *pgVar6;
  gf *pgVar7;
  char *__assertion;
  gf *pgVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  gf *a;
  code *pcStack_50;
  gf agStack_48 [8];
  fec_t *local_40;
  ulong local_38;
  
  uVar1 = (ulong)k;
  if (fec_new_gf_initialized == '\0') {
    pcStack_50 = (code *)0x1055fe;
    gf_init();
    fec_new_gf_initialized = '\x01';
  }
  pcStack_50 = (code *)0x10560d;
  local_40 = (fec_t *)malloc(0x10);
  if (local_40 == (fec_t *)0x0) {
    __assertion = "res != NULL";
    __line = 0x30;
  }
  else {
    pcStack_50 = (code *)0x105628;
    pgVar2 = (gf *)malloc(n * uVar1);
    local_40->gen_matrix = pgVar2;
    if (pgVar2 != (gf *)0x0) {
      local_40->k = k;
      local_40->n = n;
      local_38 = (ulong)n;
      uVar3 = (ulong)(n * k) + 0xf & 0xfffffffffffffff0;
      lVar9 = -uVar3;
      a = agStack_48 + lVar9;
      agStack_48[-uVar3] = '\x01';
      pgVar5 = agStack_48 + lVar9 + -8;
      pgVar5[0] = '\x01';
      pgVar5[1] = '\0';
      pgVar5[2] = '\0';
      pgVar5[3] = '\0';
      pgVar5[4] = '\0';
      pgVar5[5] = '\0';
      pgVar5[6] = '\0';
      pgVar5[7] = '\0';
      for (uVar3 = *(ulong *)(agStack_48 + lVar9 + -8); uVar3 < uVar1; uVar3 = uVar3 + 1) {
        a[uVar3] = '\0';
      }
      iVar4 = (int)local_38;
      pgVar8 = a;
      for (iVar10 = 0; pgVar8 = pgVar8 + uVar1, iVar10 != iVar4 + -1; iVar10 = iVar10 + 1) {
        uVar3 = 0;
        uVar11 = 0;
        while( true ) {
          if (uVar11 == uVar1) break;
          pgVar8[uVar11] = gf_polys[uVar3 % 0xff];
          uVar11 = uVar11 + 1;
          uVar3 = (ulong)(uint)((int)uVar3 + iVar10);
        }
      }
      pgVar6 = agStack_48 + lVar9 + -8;
      pgVar6[0] = 0xdc;
      pgVar6[1] = 'V';
      pgVar6[2] = '\x10';
      pgVar6[3] = '\0';
      pgVar6[4] = '\0';
      pgVar6[5] = '\0';
      pgVar6[6] = '\0';
      pgVar6[7] = '\0';
      matrix_inv_vandermonde(a,k);
      iVar4 = (int)local_38;
      pgVar7 = agStack_48 + lVar9 + -8;
      pgVar7[0] = 0xff;
      pgVar7[1] = 'V';
      pgVar7[2] = '\x10';
      pgVar7[3] = '\0';
      pgVar7[4] = '\0';
      pgVar7[5] = '\0';
      pgVar7[6] = '\0';
      pgVar7[7] = '\0';
      matrix_mul(a + k * k,a,pgVar2 + k * k,iVar4 - k,k,k);
      lVar9 = 0;
      for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
        for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
          if (uVar3 == uVar11) {
            pgVar2[(int)uVar3 * k + (int)uVar3] = '\x01';
          }
          else {
            pgVar2[(uint)((int)lVar9 + (int)uVar11)] = '\0';
          }
        }
        lVar9 = lVar9 + uVar1;
      }
      return local_40;
    }
    __assertion = "res->gen_matrix != NULL";
    __line = 0x32;
  }
  pcStack_50 = fec_encode;
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",
                __line,"fec_t *fec_new(unsigned int, unsigned int)");
}

Assistant:

fec_t *fec_new(unsigned int k, unsigned int n) {
  assert((k <= n ) || "k is too big");
  assert((k <= 256) || "k is too big");
  assert((n <= 256) || "n is too big");

  /*M
    Init Galois arithmetic if not already initialized.
  **/
  static int gf_initialized = 0;
  if (!gf_initialized) {
    gf_init();
    gf_initialized = 1;
  }

  fec_t *res;
  res = malloc(sizeof(fec_t));
  assert(res != NULL);
  res->gen_matrix = malloc(sizeof(gf)*k*n);
  assert(res->gen_matrix != NULL);

  res->k = k;
  res->n = n;

  /*M
    Fill the matrix with powers of field elements.
  **/
  gf tmp[k*n];
  /*  gf *tmp = res->gen_matrix; */

  /*M
    First row is special (powers of $0$).
  **/
  tmp[0] = 1;
  unsigned int col;
  for (col = 1; col < k; col++)
    tmp[col] = 0;
  
  gf *p;
  unsigned int row;
  for (p = tmp + k, row = 0; row < n - 1; row++, p += k) {
    for (col = 0; col < k; col++)
      p[col] = gf_polys[(row * col) % 255];
  }

#ifdef DEBUG
  fprintf(stderr, "first vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Invert the upper $k \times k$ vandermonde matrix.
  **/
  matrix_inv_vandermonde(tmp, k);

#ifdef DEBUG
  fprintf(stderr, "\ninverted vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Multiply the inverted upper $k \times k$ vandermonde matrix with
    the lower band of the matrix.
  **/
  matrix_mul(tmp + k * k, tmp, res->gen_matrix + k * k, n - k, k, k);

  /*M
    Fill the upper $k \times k$ matrix with the identity matrix to
    generate a systematic matrix.
  **/
  for (row = 0; row < k; row++)
    for (col = 0; col < k; col++)
      if (col == row)
        res->gen_matrix[row * k + col] = 1;
      else
        res->gen_matrix[row * k + col] = 0;

#ifdef DEBUG
  fprintf(stderr, "\ngenerated matrix\n");
  matrix_print(res->gen_matrix, res->n, res->k);
#endif
  
  return res;
}